

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qerrormessage.cpp
# Opt level: O1

void __thiscall QErrorMessage::~QErrorMessage(QErrorMessage *this)

{
  QtMessageHandler p_Var1;
  
  *(undefined ***)&(this->super_QDialog).super_QWidget = &PTR_metaObject_0080f2c8;
  *(undefined ***)&(this->super_QDialog).super_QWidget.super_QPaintDevice =
       &PTR__QErrorMessage_0080f4a0;
  if (qtMessageHandler == this) {
    qtMessageHandler = (QErrorMessage *)0x0;
    p_Var1 = (QtMessageHandler)
             qInstallMessageHandler((_func_void_QtMsgType_QMessageLogContext_ptr_QString_ptr *)0x0);
    if (p_Var1 == jump) {
      p_Var1 = originalMessageHandler;
    }
    qInstallMessageHandler((_func_void_QtMsgType_QMessageLogContext_ptr_QString_ptr *)p_Var1);
    originalMessageHandler = (QtMessageHandler)0x0;
  }
  QDialog::~QDialog(&this->super_QDialog);
  return;
}

Assistant:

QErrorMessage::~QErrorMessage()
{
    if (this == qtMessageHandler) {
        qtMessageHandler = nullptr;
        QtMessageHandler currentMessagHandler = qInstallMessageHandler(nullptr);
        if (currentMessagHandler != jump)
            qInstallMessageHandler(currentMessagHandler);
        else
            qInstallMessageHandler(originalMessageHandler);
        originalMessageHandler = nullptr;
    }
}